

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::FilteredDirectoryContentsTask::inputsAvailable
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  FileInfo outputInfo;
  bool bVar1;
  char *pcVar2;
  StringList *filters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  StringRef path;
  error_code eVar3;
  undefined8 in_stack_fffffffffffffcf8;
  BuildValue *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  BuildValue local_2e0;
  ValueType local_270;
  int local_258;
  error_category *local_250;
  FilteredDirectoryContentsTask *local_248;
  undefined1 local_238 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  BuildValue local_1d0;
  ValueType local_160;
  FileInfo *local_148;
  FileInfo *info;
  ValueType local_d0;
  BuildValue local_b8;
  ValueType local_48;
  FilteredDirectoryContentsTask *local_30;
  FilteredDirectoryContentsTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (FilteredDirectoryContentsTask *)ti.impl;
  local_30 = this;
  bVar1 = llbuild::buildsystem::BuildValue::isMissingInput(&this->directoryValue);
  if (bVar1) {
    llbuild::buildsystem::BuildValue::makeMissingInput();
    llbuild::buildsystem::BuildValue::toData(&local_48,&local_b8);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_48,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_b8);
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isExistingInput(&this->directoryValue);
    if (bVar1) {
      local_148 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
      bVar1 = llbuild::basic::FileInfo::isDirectory(local_148);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238);
        ti_local.ctx = &this->path;
        local_248 = (FilteredDirectoryContentsTask *)std::__cxx11::string::data();
        pcVar2 = (char *)std::__cxx11::string::length();
        path.Length = &this->filters;
        filters = (StringList *)local_238;
        path.Data = pcVar2;
        eVar3 = getFilteredContents(local_248,path,filters,in_R8);
        local_250 = eVar3._M_cat;
        local_258 = eVar3._M_value;
        llvm::ArrayRef<std::__cxx11::string>::ArrayRef<std::allocator<std::__cxx11::string>>
                  ((ArrayRef<std::__cxx11::string> *)&local_2f0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_238);
        values.Length = (size_type)filters;
        values.Data = local_2e8;
        llbuild::buildsystem::BuildValue::makeFilteredDirectoryContents(&local_2e0,local_2f0,values)
        ;
        llbuild::buildsystem::BuildValue::toData(&local_270,&local_2e0);
        llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_270,false);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_270);
        llbuild::buildsystem::BuildValue::~BuildValue(&local_2e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
      }
      else {
        memcpy(&filenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148,0x50);
        outputInfo.inode = local_210;
        outputInfo.device = uStack_218;
        outputInfo.mode = uStack_208;
        outputInfo.size = local_200;
        outputInfo.modTime.seconds = uStack_1f8;
        outputInfo.modTime.nanoseconds = local_1f0;
        outputInfo.checksum.bytes._0_8_ = uStack_1e8;
        outputInfo.checksum.bytes._8_8_ = local_1e0;
        outputInfo.checksum.bytes._16_8_ = uStack_1d8;
        outputInfo.checksum.bytes[0x18] = (char)in_stack_fffffffffffffcf8;
        outputInfo.checksum.bytes[0x19] = (char)((ulong)in_stack_fffffffffffffcf8 >> 8);
        outputInfo.checksum.bytes[0x1a] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x10);
        outputInfo.checksum.bytes[0x1b] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x18);
        outputInfo.checksum.bytes[0x1c] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        outputInfo.checksum.bytes[0x1d] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x28);
        outputInfo.checksum.bytes[0x1e] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x30);
        outputInfo.checksum.bytes[0x1f] = (char)((ulong)in_stack_fffffffffffffcf8 >> 0x38);
        llbuild::buildsystem::BuildValue::makeExistingInput(outputInfo);
        llbuild::buildsystem::BuildValue::toData(&local_160,&local_1d0);
        llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_160,false);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_160);
        llbuild::buildsystem::BuildValue::~BuildValue(&local_1d0);
      }
    }
    else {
      llbuild::buildsystem::BuildValue::makeFailedInput();
      llbuild::buildsystem::BuildValue::toData(&local_d0,(BuildValue *)&info);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_d0,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d0);
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&info);
    }
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (!directoryValue.isExistingInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    auto& info = directoryValue.getOutputInfo();

    // Non-directory things are just plain-ol' inputs
    if (!info.isDirectory()) {
      ti.complete(BuildValue::makeExistingInput(info).toData());
      return;
    }

    // Collect the filtered contents
    std::vector<std::string> filenames;
    getFilteredContents(path, filters, filenames);

    // Create the result.
    ti.complete(BuildValue::makeFilteredDirectoryContents(filenames).toData());
  }